

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-ping-pong.c
# Opt level: O1

void pinger_on_close(uv_handle_t *handle)

{
  uv_handle_t *__ptr;
  long *__ptr_00;
  int64_t eval_b;
  int64_t eval_a;
  long local_10;
  
  __ptr = (uv_handle_t *)handle->data;
  local_10 = 1000;
  if (*(int *)((long)&__ptr->data + 4) == 1000) {
    if ((uv_handle_t *)&__ptr->type != handle) {
      uv_close((uv_handle_t *)&__ptr->type,ponger_on_close);
      __ptr = handle;
    }
    free(__ptr);
    completed_pingers = completed_pingers + 1;
    return;
  }
  __ptr_00 = &local_10;
  pinger_on_close_cold_1();
  if ((long *)*__ptr_00 != (long *)0x0) {
    __ptr_00 = (long *)*__ptr_00;
  }
  free(__ptr_00);
  return;
}

Assistant:

static void pinger_on_close(uv_handle_t* handle) {
  pinger_t* pinger = (pinger_t*) handle->data;

  ASSERT_EQ(NUM_PINGS, pinger->pongs);

  if (handle == (uv_handle_t*) &pinger->stream.tcp) {
    free(pinger); /* also frees handle */
  } else {
    uv_close((uv_handle_t*) &pinger->stream.tcp, ponger_on_close);
    free(handle);
  }

  completed_pingers++;
}